

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O0

int Potassco::xconvert(char *x,longlong *out,char **errPos,int param_4)

{
  bool bVar1;
  int iVar2;
  char **in_RDX;
  longlong in_RSI;
  char *in_RDI;
  longlong *unaff_retaddr;
  int tok;
  
  bVar1 = parseSigned((char **)CONCAT44(param_4,tok),unaff_retaddr,(longlong)in_RDI,in_RSI);
  iVar2 = parsed((uint)bVar1,in_RDI,in_RDX);
  return iVar2;
}

Assistant:

int xconvert(const char* x, long long& out, const char** errPos, int) {
	int tok = parseSigned(x, out, LLONG_MIN, LLONG_MAX);
	return parsed(tok, x, errPos);
}